

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

void __thiscall
mp::BasicExprFactory<AllocatorRef<MockAllocator,_char>_>::~BasicExprFactory
          (BasicExprFactory<AllocatorRef<MockAllocator,_char>_> *this)

{
  BasicExprFactory<AllocatorRef<MockAllocator,_char>_> *in_RDI;
  
  ~BasicExprFactory(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

virtual ~BasicExprFactory() {
    Deallocate(exprs_);
    Deallocate(funcs_);
  }